

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O0

void __thiscall
SequenceDistanceGraph::load_from_gfa1(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  Support support;
  byte bVar1;
  bool bVar2;
  mapped_type mVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  size_type sVar8;
  istream *piVar9;
  mapped_type *pmVar10;
  undefined4 extraout_var;
  long lVar11;
  logic_error *plVar12;
  size_type *psVar13;
  sgNodeID_t sVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  char *pcVar17;
  pointer ppVar18;
  runtime_error *this_00;
  void *this_01;
  istream *in_RDX;
  istream *in_RSI;
  long in_RDI;
  iterator d;
  istringstream gap_ss;
  istringstream iss;
  uint64_t dist_egt0;
  uint64_t lcount;
  int32_t dist;
  sgNodeID_t dest_id;
  sgNodeID_t src_id;
  string seq_location;
  string gap_dir;
  string gap_id;
  string gfa_length;
  string gfa_star;
  string gfa_cigar;
  string gfa_destdir;
  string gfa_dest;
  string gfa_sourcedir;
  string gfa_source;
  string gfa_rtype;
  int i;
  uint64_t rcnodes;
  sgNodeID_t nextid;
  string seq;
  string name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  string line;
  Node *in_stack_fffffffffffff448;
  SequenceDistanceGraph *in_stack_fffffffffffff450;
  string *in_stack_fffffffffffff458;
  Node *in_stack_fffffffffffff460;
  Node *in_stack_fffffffffffff468;
  Node *in_stack_fffffffffffff470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff480;
  DistanceGraph *in_stack_fffffffffffff488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff498;
  int32_t in_stack_fffffffffffff49c;
  undefined4 in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a4;
  undefined4 in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4ac;
  DistanceGraph *this_02;
  mapped_type mVar19;
  uint uVar20;
  undefined4 in_stack_fffffffffffff4c4;
  Node *in_stack_fffffffffffff4d0;
  byte local_a3a;
  Support local_940;
  undefined1 local_929;
  string local_8e8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_8c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_8c0;
  allocator local_8b1;
  string local_8b0 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_858;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_850;
  allocator local_841;
  string local_840 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_7e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_7e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_7d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_7d0;
  istringstream local_7c8 [384];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_648;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_640;
  undefined1 local_631;
  undefined1 local_610 [160];
  string local_570 [32];
  string local_550 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_530;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_528;
  string local_520 [32];
  istringstream local_500 [384];
  ulong local_380;
  ulong local_378;
  uint local_36c;
  mapped_type local_368;
  DistanceGraph *local_360;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [36];
  int local_1f4;
  undefined1 local_1b1;
  string local_190 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_170;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_168;
  ulong local_160;
  undefined8 local_158;
  allocator local_149;
  string local_148 [95];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [104];
  string local_38 [32];
  istream *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
  poVar6 = std::operator<<(poVar6,"Graph fasta filesname: ");
  poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x78));
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
  poVar6 = std::operator<<(poVar6,"Loading sequences from ");
  poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x78));
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)0x3715a3);
  std::__cxx11::string::string(local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::reserve((ulong)local_c0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           *)0x371618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::vector<Node,_std::allocator<Node>_>::clear((vector<Node,_std::allocator<Node>_> *)0x3716a3);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           *)0x3716b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"",&local_149);
  Node::Node(in_stack_fffffffffffff470,&in_stack_fffffffffffff468->sequence,
             (NodeStatus)((ulong)in_stack_fffffffffffff460 >> 0x38));
  add_node(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  Node::~Node((Node *)0x371727);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_158 = 1;
  local_160 = 0;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_18,local_38);
    bVar1 = std::ios::eof();
    if (((bVar1 & 1) == 0) &&
       (pcVar17 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar17 != '>')) {
      std::__cxx11::string::operator+=(local_c0,local_38);
    }
    else {
      uVar16 = std::__cxx11::string::empty();
      if ((uVar16 & 1) == 0) {
        local_168._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff448,(key_type *)0x37182f);
        local_170._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    *)in_stack_fffffffffffff448);
        bVar2 = std::__detail::operator!=(&local_168,&local_170);
        if (bVar2) {
          local_1b1 = 1;
          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                         in_stack_fffffffffffff490);
          std::operator+(in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450);
          std::logic_error::logic_error(plVar12,local_190);
          local_1b1 = 0;
          __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        Node::Node(in_stack_fffffffffffff460,in_stack_fffffffffffff458);
        sVar14 = add_node(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        pmVar15 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
        *pmVar15 = sVar14;
        Node::~Node((Node *)0x371b19);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
        std::vector<Node,_std::allocator<Node>_>::back
                  ((vector<Node,_std::allocator<Node>_> *)in_stack_fffffffffffff450);
        bVar2 = Node::is_canonical(in_stack_fffffffffffff468);
        if (!bVar2) {
          std::vector<Node,_std::allocator<Node>_>::back
                    ((vector<Node,_std::allocator<Node>_> *)in_stack_fffffffffffff450);
          Node::make_rc(in_stack_fffffffffffff4d0);
          pmVar15 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                  *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
          lVar11 = *pmVar15;
          pmVar15 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                  *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
          *pmVar15 = -lVar11;
          local_160 = local_160 + 1;
        }
      }
      std::__cxx11::string::clear();
      local_1f4 = 1;
      while( true ) {
        uVar16 = (ulong)local_1f4;
        uVar7 = std::__cxx11::string::size();
        bVar2 = false;
        if (uVar16 < uVar7) {
          pcVar17 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          bVar2 = *pcVar17 != ' ';
        }
        if (!bVar2) break;
        pcVar17 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        std::__cxx11::string::operator+=(local_a0,*pcVar17);
        local_1f4 = local_1f4 + 1;
      }
      std::__cxx11::string::operator=(local_c0,"");
    }
  }
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
  sVar8 = std::vector<Node,_std::allocator<Node>_>::size
                    ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8 - 1);
  poVar6 = std::operator<<(poVar6," nodes loaded (");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_160);
  poVar6 = std::operator<<(poVar6," canonised).");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_218);
  std::__cxx11::string::string(local_238);
  std::__cxx11::string::string(local_258);
  std::__cxx11::string::string(local_278);
  std::__cxx11::string::string(local_298);
  std::__cxx11::string::string(local_2b8);
  std::__cxx11::string::string(local_2d8);
  std::__cxx11::string::string(local_2f8);
  std::__cxx11::string::string(local_318);
  std::__cxx11::string::string(local_338);
  std::__cxx11::string::string(local_358);
  local_378 = 0;
  local_380 = 0;
  while( true ) {
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)));
    local_a3a = 0;
    if (bVar2) {
      local_a3a = std::ios::eof();
      local_a3a = local_a3a ^ 0xff;
    }
    if ((local_a3a & 1) == 0) break;
    std::__cxx11::istringstream::istringstream(local_500,local_38,_S_in);
    std::operator>>((istream *)local_500,local_218);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
    if (bVar2) {
      std::operator>>((istream *)local_500,local_238);
      std::operator>>((istream *)local_500,local_2d8);
      std::operator>>((istream *)local_500,local_2f8);
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) == 0) {
        std::operator>>((istream *)local_500,local_358);
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
      if (bVar2) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"Sequences should be in a separate file.");
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
      if ((bVar2) && (uVar16 = std::__cxx11::string::empty(), (uVar16 & 1) != 0)) {
        std::__cxx11::string::substr((ulong)local_520,(ulong)local_2f8);
        mVar3 = std::__cxx11::stoi((string *)in_stack_fffffffffffff450,
                                   (size_t *)in_stack_fffffffffffff448,0);
        pmVar10 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
        *pmVar10 = mVar3;
        std::__cxx11::string::~string(local_520);
      }
      else {
        local_528._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff448,(key_type *)0x372201);
        local_530._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    *)in_stack_fffffffffffff448);
        bVar2 = std::__detail::operator!=(&local_528,&local_530);
        if (bVar2) {
          std::__cxx11::string::substr((ulong)local_550,(ulong)local_2f8);
          iVar5 = std::__cxx11::stoi((string *)in_stack_fffffffffffff450,
                                     (size_t *)in_stack_fffffffffffff448,0);
          pmVar15 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                  *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
          iVar4 = std::abs((int)*pmVar15);
          std::vector<Node,_std::allocator<Node>_>::operator[]
                    ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40),
                     CONCAT44(extraout_var,iVar4));
          lVar11 = std::__cxx11::string::length();
          std::__cxx11::string::~string(local_550);
          if (iVar5 != lVar11) {
            local_631 = 1;
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::operator+((char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                           in_stack_fffffffffffff490);
            std::operator+(in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450);
            std::__cxx11::string::substr((ulong)local_610,(ulong)local_2f8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff488,in_stack_fffffffffffff480);
            std::operator+(in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450);
            psVar13 = (size_type *)
                      std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                    *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence
                                  );
            std::vector<Node,_std::allocator<Node>_>::operator[]
                      ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40),*psVar13);
            std::__cxx11::string::length();
            std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff488,in_stack_fffffffffffff480);
            std::logic_error::logic_error(plVar12,local_570);
            local_631 = 0;
            __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
      }
      std::__cxx11::string::clear();
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
      if (bVar2) {
        std::operator>>((istream *)local_500,local_238);
        std::operator>>((istream *)local_500,local_258);
        std::operator>>((istream *)local_500,local_278);
        std::operator>>((istream *)local_500,local_298);
        std::operator>>((istream *)local_500,local_2b8);
        local_640._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)in_stack_fffffffffffff448,(key_type *)0x3726e1);
        local_648._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)in_stack_fffffffffffff448);
        bVar2 = std::__detail::operator!=(&local_640,&local_648);
        if (bVar2) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
          std::__cxx11::istringstream::istringstream(local_7c8,local_38,_S_in);
          std::operator>>((istream *)local_7c8,local_218);
          std::operator>>((istream *)local_7c8,local_318);
          std::operator>>((istream *)local_7c8,local_338);
          std::operator>>((istream *)local_7c8,local_278);
          std::operator>>((istream *)local_7c8,local_298);
          std::operator>>((istream *)local_7c8,local_2b8);
          std::__cxx11::istringstream::~istringstream(local_7c8);
        }
        local_7d0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)in_stack_fffffffffffff448,(key_type *)0x372835);
        local_7d8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)in_stack_fffffffffffff448);
        bVar2 = std::__detail::operator==(&local_7d0,&local_7d8);
        if (bVar2) {
          local_7e0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       *)in_stack_fffffffffffff448,(key_type *)0x37289e);
          local_7e8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)in_stack_fffffffffffff448);
          bVar2 = std::__detail::operator==(&local_7e0,&local_7e8);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_840,"",&local_841);
            Node::Node(in_stack_fffffffffffff460,in_stack_fffffffffffff458);
            sVar14 = add_node(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
            pmVar15 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                    *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence
                                  );
            *pmVar15 = sVar14;
            Node::~Node((Node *)0x3729a1);
            std::__cxx11::string::~string(local_840);
            std::allocator<char>::~allocator((allocator<char> *)&local_841);
          }
          local_850._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       *)in_stack_fffffffffffff448,(key_type *)0x372a45);
          local_858._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)in_stack_fffffffffffff448);
          bVar2 = std::__detail::operator==(&local_850,&local_858);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_8b0,"",&local_8b1);
            Node::Node(in_stack_fffffffffffff460,in_stack_fffffffffffff458);
            sVar14 = add_node(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
            pmVar15 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                    *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence
                                  );
            *pmVar15 = sVar14;
            Node::~Node((Node *)0x372b48);
            std::__cxx11::string::~string(local_8b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
          }
        }
        pmVar15 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
        local_360 = (DistanceGraph *)*pmVar15;
        pmVar15 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)in_stack_fffffffffffff450,&in_stack_fffffffffffff448->sequence);
        local_368 = *pmVar15;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
        if (bVar2) {
          local_360 = (DistanceGraph *)-(long)local_360;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff450,(char *)in_stack_fffffffffffff448);
        if (bVar2) {
          local_368 = -local_368;
        }
        local_36c = 0;
        uVar16 = std::__cxx11::string::size();
        if (1 < uVar16) {
          std::__cxx11::string::size();
          pcVar17 = (char *)std::__cxx11::string::operator[]((ulong)local_2b8);
          if (*pcVar17 == 'M') {
            pcVar17 = (char *)std::__cxx11::string::c_str();
            iVar5 = atoi(pcVar17);
            local_36c = -iVar5;
            if (-1 < (int)local_36c) {
              local_380 = local_380 + 1;
            }
          }
        }
        uVar16 = std::__cxx11::string::empty();
        if ((uVar16 & 1) == 0) {
          local_8c0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)in_stack_fffffffffffff448,(key_type *)0x372d8c);
          local_8c8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::cend((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)in_stack_fffffffffffff448);
          bVar2 = std::__detail::operator!=(&local_8c0,&local_8c8);
          if (!bVar2) {
            local_929 = 1;
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470);
            std::operator+(in_stack_fffffffffffff458,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff450);
            std::operator+(in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450);
            std::runtime_error::runtime_error(this_00,local_8e8);
            local_929 = 0;
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          ppVar18 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                  *)0x372de3);
          local_36c = ppVar18->second;
          std::__cxx11::string::clear();
        }
        bVar2 = DistanceGraph::are_connected
                          (in_stack_fffffffffffff488,(sgNodeID_t)in_stack_fffffffffffff480,
                           (sgNodeID_t)in_stack_fffffffffffff478);
        in_stack_fffffffffffff4c4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff4c4);
        if (!bVar2) {
          this_02 = local_360;
          mVar19 = local_368;
          uVar20 = local_36c;
          Support::Support(&local_940,Undefined,0,0);
          support.id._0_4_ = uVar20;
          support.type = (char)mVar19;
          support._1_1_ = (char)((ulong)mVar19 >> 8);
          support.index = (short)((ulong)mVar19 >> 0x10);
          support._4_4_ = (int)((ulong)mVar19 >> 0x20);
          support.id._4_4_ = in_stack_fffffffffffff4c4;
          DistanceGraph::add_link
                    (this_02,CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                     CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                     in_stack_fffffffffffff49c,support);
          local_378 = local_378 + 1;
        }
      }
    }
    std::__cxx11::istringstream::~istringstream(local_500);
  }
  if ((float)local_378 * 0.5 < (float)local_380) {
    poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
    poVar6 = std::operator<<(poVar6,"Warning: The loaded graph contains ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_380);
    in_stack_fffffffffffff478 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar6," non-overlapping links out of ");
    this_01 = (void *)std::ostream::operator<<(in_stack_fffffffffffff478,local_378);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
  sVar8 = std::vector<Node,_std::allocator<Node>_>::size
                    ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8 - 1);
  poVar6 = std::operator<<(poVar6," nodes after connecting with ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_378);
  poVar6 = std::operator<<(poVar6," links.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)0x3732a6);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SequenceDistanceGraph::load_from_gfa1(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filesname: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,gap_id,gap_dir,seq_location;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_star;
            iss >> gfa_length; // parse to number
            if (!iss.eof()) iss >> seq_location;
            if (gfa_star != "*") {
                throw std::logic_error("Sequences should be in a separate file.");
            }

            if (gfa_star == "*" and seq_location.empty()) {
                gap_dist[gfa_source] = std::stoi(gfa_length.substr(5));
            } else {
                // Check equal length seq and node length reported in gfa
                if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                    if (std::stoi(gfa_length.substr(5)) !=
                        nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                        throw std::logic_error(
                                "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                                gfa_length.substr(5) + ", fasta: " +
                                std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                    }
                }
            }
            seq_location.clear();
        } else if (gfa_rtype == "L"){
            iss >> gfa_source;
            iss >> gfa_sourcedir;
            iss >> gfa_dest;
            iss >> gfa_destdir;
            iss >> gfa_cigar;

            if (gap_dist.find(gfa_dest) != gap_dist.end()) {
                std::getline(gfaf, line);
                std::istringstream gap_ss(line);
                gap_ss >> gfa_rtype;
                gap_ss >> gap_id;        // Ignore gap_id x2
                gap_ss >> gap_dir;     // Ignore gap_dir x2
                gap_ss >> gfa_dest;        // Read dest
                gap_ss >> gfa_destdir;     // Read dest_dir
                gap_ss >> gfa_cigar;       // Ignore cigar
            }
            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (gap_dist.find(gap_id) == gap_dist.end()) {
                if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_source] = add_node(Node(""));
                    //std::cout<<"added source!" <<source<<std::endl;
                }
                if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_dest] = add_node(Node(""));
                    //std::cout<<"added dest! "<<dest<<std::endl;
                }
            }
            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;
            dist=0;
            if (gfa_cigar.size()>1 and gfa_cigar[gfa_cigar.size()-1]=='M') {
                //TODO: better checks for M
                dist=-atoi(gfa_cigar.c_str());
                if (dist>=0) {
                    dist_egt0++;
                }
            }

            if (!gap_id.empty()) {
                const auto d = gap_dist.find(gap_id);
                if (d != gap_dist.cend()) {
                    dist = d->second;
                } else {
                    throw std::runtime_error(gfa_dest + " has not been seen in " + filename +
                                             " yet, please ensure gaps are defined before being referenced");
                }
                gap_id.clear();
            }
            if (not are_connected(src_id,dest_id)) {
                add_link(src_id, dest_id, dist);
                ++lcount;
            }
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;
}